

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate2.cpp
# Opt level: O0

STAmount * jbcoin::detail::as_amount(STAmount *__return_storage_ptr__,Rate *rate)

{
  Issue *issue;
  Rate *rate_local;
  
  issue = noIssue();
  jbcoin::STAmount::STAmount(__return_storage_ptr__,issue,rate->value,-9,false);
  return __return_storage_ptr__;
}

Assistant:

STAmount as_amount (Rate const& rate)
{
    return { noIssue(), rate.value, -9, false };
}